

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  bool bVar1;
  int cached_size;
  MessageLite *this;
  uint8_t *ptr;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  *target = '\v';
  uVar3 = field->number_;
  target[1] = '\x10';
  pbVar4 = target + 2;
  uVar2 = uVar3;
  if (0x7f < uVar3) {
    do {
      *pbVar4 = (byte)uVar2 | 0x80;
      uVar3 = uVar2 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar3;
    } while (bVar1);
  }
  *pbVar4 = (byte)uVar3;
  this = &Reflection::GetMessage(MVar5.reflection,message,field,(MessageFactory *)0x0)->
          super_MessageLite;
  cached_size = MessageLite::GetCachedSize(this);
  ptr = WireFormatLite::InternalWriteMessage(3,this,cached_size,pbVar4 + 1,stream);
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  *ptr = '\f';
  return ptr + 1;
}

Assistant:

uint8_t* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
    // Write message.
    auto& msg = message_reflection->GetMessage(message, field);
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, msg, msg.GetCachedSize(),
        target, stream);
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}